

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this)

{
  bool bVar1;
  Expression *pEVar2;
  Type local_50;
  Type local_28;
  TypeMetaFunction *local_10;
  TypeMetaFunction *this_local;
  
  local_10 = this;
  pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
  bVar1 = isResolvedAsValue(pEVar2);
  if (bVar1) {
    pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])();
    throwErrorIfUnresolved(this,&local_28);
    Type::~Type(&local_28);
  }
  else {
    pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
    bVar1 = isResolvedAsType(pEVar2);
    if (bVar1) {
      pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[5])();
      throwErrorIfUnresolved(this,&local_50);
      Type::~Type(&local_50);
    }
  }
  return;
}

Assistant:

void throwErrorIfUnresolved() const
        {
            if (isResolvedAsValue (source.get()))
                throwErrorIfUnresolved (source->getResultType());
            else if (isResolvedAsType (source.get()))
                throwErrorIfUnresolved (source->resolveAsType());
        }